

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O1

bool __thiscall
wasm::SimplifyLocals<true,_false,_true>::runMainOptimizations
          (SimplifyLocals<true,_false,_true> *this,Function *func)

{
  pointer ppBVar1;
  Block *pBVar2;
  pointer ppIVar3;
  If *pIVar4;
  size_t sVar5;
  pointer ppLVar6;
  Loop *pLVar7;
  Module *in_RAX;
  Expression *pEVar8;
  Block *pBVar9;
  iterator __begin3_1;
  pointer ppIVar10;
  pointer ppLVar11;
  iterator __begin3;
  pointer ppBVar12;
  Builder local_38;
  
  this->anotherCycle = false;
  local_38.wasm = in_RAX;
  Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
  ::walk((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
          *)&(this->
             super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
             ).
             super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
         ,&func->body);
  ppBVar12 = (this->blocksToEnlarge).
             super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppBVar1 = (this->blocksToEnlarge).
            super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppBVar1 != ppBVar12) {
    do {
      pBVar2 = *ppBVar12;
      pEVar8 = (Expression *)
               MixedArena::allocSpace
                         (&((this->
                            super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                            ).
                            super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                            .
                            super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                            .
                            super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                           .currModule)->allocator,0x10,8);
      pEVar8->_id = NopId;
      (pEVar8->type).id = 0;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(pBVar2->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar8)
      ;
      ppBVar12 = ppBVar12 + 1;
    } while (ppBVar12 != ppBVar1);
    ppBVar12 = (this->blocksToEnlarge).
               super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->blocksToEnlarge).super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppBVar12) {
      (this->blocksToEnlarge).super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppBVar12;
    }
    this->anotherCycle = true;
  }
  ppIVar10 = (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppIVar3 = (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppIVar3 != ppIVar10) {
    do {
      pIVar4 = *ppIVar10;
      local_38.wasm =
           (this->
           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
           ).
           super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
           .
           super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
           .
           super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
           .currModule;
      pBVar2 = (Block *)pIVar4->ifTrue;
      if (pBVar2 == (Block *)0x0) {
        pBVar9 = (Block *)0x0;
      }
      else {
        pBVar9 = (Block *)0x0;
        if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
            BlockId) {
          pBVar9 = pBVar2;
        }
      }
      if ((pBVar9 == (Block *)0x0) || ((pBVar9->name).super_IString.str._M_str != (char *)0x0)) {
        pBVar9 = Builder::makeBlock(&local_38,(Expression *)pBVar2);
      }
      (pBVar9->name).super_IString.str._M_len = 0;
      (pBVar9->name).super_IString.str._M_str = (char *)0x0;
      pIVar4->ifTrue = (Expression *)pBVar9;
      sVar5 = (pBVar9->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      if ((sVar5 == 0) ||
         ((pBVar9->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          data[sVar5 - 1]->_id != NopId)) {
        pEVar8 = (Expression *)
                 MixedArena::allocSpace
                           (&((this->
                              super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                              ).
                              super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                              .
                              super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                              .
                              super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                             .currModule)->allocator,0x10,8);
        pEVar8->_id = NopId;
        (pEVar8->type).id = 0;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(pBVar9->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   pEVar8);
      }
      pBVar2 = (Block *)pIVar4->ifFalse;
      if (pBVar2 != (Block *)0x0) {
        local_38.wasm =
             (this->
             super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
             ).
             super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
             .
             super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
             .
             super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
             .currModule;
        pBVar9 = (Block *)0x0;
        if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
            BlockId) {
          pBVar9 = pBVar2;
        }
        if ((pBVar9 == (Block *)0x0) || ((pBVar9->name).super_IString.str._M_str != (char *)0x0)) {
          pBVar9 = Builder::makeBlock(&local_38,(Expression *)pBVar2);
        }
        (pBVar9->name).super_IString.str._M_len = 0;
        (pBVar9->name).super_IString.str._M_str = (char *)0x0;
        pIVar4->ifFalse = (Expression *)pBVar9;
        sVar5 = (pBVar9->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements;
        if ((sVar5 == 0) ||
           ((pBVar9->list).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
            [sVar5 - 1]->_id != NopId)) {
          pEVar8 = (Expression *)
                   MixedArena::allocSpace
                             (&((this->
                                super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                                ).
                                super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                                .
                                super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                                .
                                super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                               .currModule)->allocator,0x10,8);
          pEVar8->_id = NopId;
          (pEVar8->type).id = 0;
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&(pBVar9->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     pEVar8);
        }
      }
      ppIVar10 = ppIVar10 + 1;
    } while (ppIVar10 != ppIVar3);
    ppIVar10 = (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar10) {
      (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar10;
    }
    this->anotherCycle = true;
  }
  ppLVar11 = (this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppLVar6 = (this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar6 != ppLVar11) {
    do {
      pLVar7 = *ppLVar11;
      local_38.wasm =
           (this->
           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
           ).
           super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
           .
           super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
           .
           super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
           .currModule;
      pBVar2 = (Block *)pLVar7->body;
      if (pBVar2 == (Block *)0x0) {
        pBVar9 = (Block *)0x0;
      }
      else {
        pBVar9 = (Block *)0x0;
        if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
            BlockId) {
          pBVar9 = pBVar2;
        }
      }
      if ((pBVar9 == (Block *)0x0) || ((pBVar9->name).super_IString.str._M_str != (char *)0x0)) {
        pBVar9 = Builder::makeBlock(&local_38,(Expression *)pBVar2);
      }
      (pBVar9->name).super_IString.str._M_len = 0;
      (pBVar9->name).super_IString.str._M_str = (char *)0x0;
      pLVar7->body = (Expression *)pBVar9;
      sVar5 = (pBVar9->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      if ((sVar5 == 0) ||
         ((pBVar9->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          data[sVar5 - 1]->_id != NopId)) {
        pEVar8 = (Expression *)
                 MixedArena::allocSpace
                           (&((this->
                              super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                              ).
                              super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                              .
                              super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                              .
                              super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                             .currModule)->allocator,0x10,8);
        pEVar8->_id = NopId;
        (pEVar8->type).id = 0;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(pBVar9->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   pEVar8);
      }
      ppLVar11 = ppLVar11 + 1;
    } while (ppLVar11 != ppLVar6);
    ppLVar11 = (this->loopsToEnlarge).
               super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppLVar11) {
      (this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>._M_impl
      .super__Vector_impl_data._M_finish = ppLVar11;
    }
    this->anotherCycle = true;
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>_>
  ::clear(&(this->sinkables)._M_t);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_false,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_false,_true>::BlockBreak>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_false,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_false,_true>::BlockBreak>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_false,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_false,_true>::BlockBreak>_>_>_>_>
  ::clear(&(this->blockBreaks)._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::clear(&(this->unoptimizableBlocks)._M_t);
  return this->anotherCycle;
}

Assistant:

bool runMainOptimizations(Function* func) {
    anotherCycle = false;
    WalkerPass<LinearExecutionWalker<
      SimplifyLocals<allowTee, allowStructure, allowNesting>>>::
      doWalkFunction(func);
    // enlarge blocks that were marked, for the next round
    if (blocksToEnlarge.size() > 0) {
      for (auto* block : blocksToEnlarge) {
        block->list.push_back(
          this->getModule()->allocator.template alloc<Nop>());
      }
      blocksToEnlarge.clear();
      anotherCycle = true;
    }
    // enlarge ifs that were marked, for the next round
    if (ifsToEnlarge.size() > 0) {
      for (auto* iff : ifsToEnlarge) {
        auto ifTrue =
          Builder(*this->getModule()).blockifyWithName(iff->ifTrue, Name());
        iff->ifTrue = ifTrue;
        if (ifTrue->list.size() == 0 ||
            !ifTrue->list.back()->template is<Nop>()) {
          ifTrue->list.push_back(
            this->getModule()->allocator.template alloc<Nop>());
        }
        if (iff->ifFalse) {
          auto ifFalse =
            Builder(*this->getModule()).blockifyWithName(iff->ifFalse, Name());
          iff->ifFalse = ifFalse;
          if (ifFalse->list.size() == 0 ||
              !ifFalse->list.back()->template is<Nop>()) {
            ifFalse->list.push_back(
              this->getModule()->allocator.template alloc<Nop>());
          }
        }
      }
      ifsToEnlarge.clear();
      anotherCycle = true;
    }
    // enlarge loops that were marked, for the next round
    if (loopsToEnlarge.size() > 0) {
      for (auto* loop : loopsToEnlarge) {
        auto block =
          Builder(*this->getModule()).blockifyWithName(loop->body, Name());
        loop->body = block;
        if (block->list.size() == 0 ||
            !block->list.back()->template is<Nop>()) {
          block->list.push_back(
            this->getModule()->allocator.template alloc<Nop>());
        }
      }
      loopsToEnlarge.clear();
      anotherCycle = true;
    }
    // clean up
    sinkables.clear();
    blockBreaks.clear();
    unoptimizableBlocks.clear();
    return anotherCycle;
  }